

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O2

void __thiscall
SmallVector_CapacityReserve_Test::SmallVector_CapacityReserve_Test
          (SmallVector_CapacityReserve_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00224908;
  return;
}

Assistant:

TEST (SmallVector, CapacityReserve) {
    pstore::small_vector<int, 4> a;
    EXPECT_EQ (a.capacity (), 4U);
    a.reserve (1U);
    EXPECT_EQ (a.capacity (), 4U);
    a.reserve (10U);
    EXPECT_EQ (a.capacity (), 10U);
    a.reserve (1U);
    EXPECT_EQ (a.capacity (), 10U);
}